

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O3

void __thiscall
Variable_nullParentOfVariable_Test::TestBody(Variable_nullParentOfVariable_Test *this)

{
  char cVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  VariablePtr v;
  void *local_40;
  shared_ptr<libcellml::ParentedEntity> local_38;
  internal local_28 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  libcellml::Variable::create();
  local_40 = (void *)0x0;
  libcellml::ParentedEntity::parent();
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::ParentedEntity>>
            (local_28,"nullptr","v->parent()",&local_40,&local_38);
  if (local_38.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_20[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_20[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x1ef,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if (local_38.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') &&
         (local_38.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0)) {
        (**(code **)(*(long *)local_38.
                              super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
  }
  return;
}

Assistant:

TEST(Variable, nullParentOfVariable)
{
    libcellml::VariablePtr v = libcellml::Variable::create();
    EXPECT_EQ(nullptr, v->parent());
}